

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

PsbtBip32DataStruct * __thiscall cfd::api::json::PsbtBip32Data::ConvertToStruct(PsbtBip32Data *this)

{
  long in_RSI;
  PsbtBip32DataStruct *in_RDI;
  PsbtBip32DataStruct *in_stack_00000010;
  PsbtBip32DataStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  PsbtBip32DataStruct *this_00;
  
  this_00 = in_RDI;
  PsbtBip32DataStruct::PsbtBip32DataStruct(in_stack_00000010);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->master_fingerprint,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->path,(string *)(in_RSI + 0x78));
  std::__cxx11::string::operator=((string *)&in_RDI->descriptor,(string *)(in_RSI + 0x98));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

PsbtBip32DataStruct PsbtBip32Data::ConvertToStruct() const {  // NOLINT
  PsbtBip32DataStruct result;
  result.pubkey = pubkey_;
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.descriptor = descriptor_;
  result.ignore_items = ignore_items;
  return result;
}